

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::numbers_internal::safe_strto64_base
          (numbers_internal *this,string_view text,Nonnull<int64_t_*> value,int base)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  
  uVar6 = (uint)value;
  pbVar12 = (byte *)text._M_len;
  *(long *)text._M_str = 0;
  if (pbVar12 == (byte *)0x0) {
    return false;
  }
  pbVar14 = pbVar12;
  if (0 < (long)this) {
    do {
      if (((&ascii_internal::kPropertyBits)[*pbVar14] & 8) == 0) break;
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 < pbVar12 + (long)this);
  }
  do {
    if (pbVar12 + (long)this <= pbVar14) {
      return false;
    }
    pbVar7 = pbVar12 + -1 + (long)this;
    this = this + -1;
  } while (((&ascii_internal::kPropertyBits)[*pbVar7] & 8) != 0);
  bVar1 = *pbVar14;
  pbVar7 = pbVar12 + (long)this + 1;
  if (((bVar1 == 0x2d) || (bVar1 == 0x2b)) && (pbVar14 = pbVar14 + 1, pbVar7 <= pbVar14)) {
    return false;
  }
  if (uVar6 == 0x10) {
    pbVar10 = pbVar12 + (long)this + 1;
    uVar6 = 0x10;
    if (((1 < (long)(pbVar12 + (long)this + (1 - (long)pbVar14))) && (*pbVar14 == 0x30)) &&
       (((pbVar14[1] | 0x20) == 0x78 && (pbVar14 = pbVar14 + 2, pbVar7 <= pbVar14)))) {
      return false;
    }
  }
  else if (uVar6 == 0) {
    pbVar10 = pbVar12 + (long)this + 1;
    if (((long)(pbVar12 + (long)this) - (long)pbVar14) + 1 < 2) {
      uVar6 = 10;
      if ((long)(pbVar12 + (long)this) - (long)pbVar14 == 0) {
        bVar2 = *pbVar14;
        pbVar14 = pbVar14 + (bVar2 == 0x30);
        uVar6 = (uint)(bVar2 != 0x30) * 2 + 8;
      }
    }
    else if (*pbVar14 == 0x30) {
      if ((pbVar14[1] | 0x20) == 0x78) {
        pbVar14 = pbVar14 + 2;
        if (pbVar7 <= pbVar14) {
          return false;
        }
        uVar6 = 0x10;
      }
      else {
        pbVar14 = pbVar14 + 1;
        uVar6 = 8;
      }
    }
    else {
      uVar6 = 10;
    }
  }
  else {
    pbVar10 = pbVar7;
    if (0x22 < uVar6 - 2) {
      return false;
    }
  }
  lVar11 = (long)pbVar10 - (long)pbVar14;
  uVar13 = CONCAT44(0,uVar6);
  if (bVar1 == 0x2d) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar13;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar3,0) +
        *(long *)(lts_20250127::(anonymous_namespace)::LookupTables<long>::kVminOverBase +
                 uVar13 * 8) != 0) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x403,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                   );
    }
    bVar5 = true;
    if (0 < lVar11) {
      pbVar12 = pbVar14 + lVar11;
      lVar11 = 0;
      do {
        iVar8 = (int)(char)lts_20250127::(anonymous_namespace)::kAsciiToInt[*pbVar14];
        if ((int)uVar6 <= iVar8) goto LAB_004a5921;
        if (lVar11 < *(long *)(lts_20250127::(anonymous_namespace)::LookupTables<long>::
                               kVminOverBase + uVar13 * 8)) {
LAB_004a5925:
          bVar5 = false;
          lVar11 = -0x8000000000000000;
          break;
        }
        if ((long)(lVar11 * uVar13) < (long)((long)iVar8 | 0x8000000000000000U)) goto LAB_004a5925;
        lVar11 = lVar11 * uVar13 - (long)iVar8;
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 < pbVar12);
      goto LAB_004a5931;
    }
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar13;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar4,0) !=
        *(long *)(lts_20250127::(anonymous_namespace)::LookupTables<long>::kVmaxOverBase +
                 uVar13 * 8)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/numbers.cc"
                    ,0x3e0,
                    "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = long]"
                   );
    }
    bVar5 = true;
    if (0 < lVar11) {
      pbVar12 = pbVar14 + lVar11;
      lVar11 = 0;
      do {
        lVar9 = (long)(char)lts_20250127::(anonymous_namespace)::kAsciiToInt[*pbVar14];
        if ((long)uVar13 <= lVar9) goto LAB_004a5921;
        if ((*(long *)(lts_20250127::(anonymous_namespace)::LookupTables<long>::kVmaxOverBase +
                      uVar13 * 8) < lVar11) ||
           (lVar11 = lVar11 * uVar13,
           lVar11 - (0x7fffffffffffffff - lVar9) != 0 && 0x7fffffffffffffff - lVar9 <= lVar11)) {
          bVar5 = false;
          lVar11 = 0x7fffffffffffffff;
          break;
        }
        lVar11 = lVar11 + lVar9;
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 < pbVar12);
      goto LAB_004a5931;
    }
  }
  bVar5 = true;
  lVar11 = 0;
LAB_004a5931:
  *(long *)text._M_str = lVar11;
  return bVar5;
LAB_004a5921:
  bVar5 = false;
  goto LAB_004a5931;
}

Assistant:

bool safe_strto64_base(absl::string_view text, absl::Nonnull<int64_t*> value,
                       int base) {
  return safe_int_internal<int64_t>(text, value, base);
}